

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_5d3b69::cmFunctionHelperCommand::operator()
          (cmFunctionHelperCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *inStatus)

{
  pointer pbVar1;
  pointer this_00;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  ulong uVar6;
  reference pvVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables;
  string_view sVar8;
  bool local_471;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c0;
  undefined1 local_398 [8];
  cmExecutionStatus status;
  cmListFileFunction *func;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range1;
  string_view local_310;
  string local_300;
  string_view local_2e0;
  string_view local_2d0;
  string_view local_2c0;
  string_view local_2b0;
  string_view local_2a0;
  string_view local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_270;
  undefined1 local_260 [8];
  string argnDef;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  eit;
  string_view local_220;
  undefined1 local_210 [8];
  string argvDef;
  uint local_1dc;
  uint j;
  string local_1c8;
  cmAlphaNum local_1a8;
  cmAlphaNum local_178;
  undefined1 local_148 [8];
  string value;
  undefined1 local_120 [4];
  uint t;
  string_view local_100;
  undefined1 local_f0 [8];
  FunctionPushPop functionScope;
  cmAlphaNum local_d8;
  cmAlphaNum local_a8;
  undefined1 local_78 [8];
  string errorMsg;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  cmMakefile *makefile;
  cmExecutionStatus *inStatus_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  cmFunctionHelperCommand *this_local;
  
  expandedArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)cmExecutionStatus::GetMakefile(inStatus);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  cmMakefile::ExpandArguments
            ((cmMakefile *)
             expandedArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_48);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->Args);
  if (sVar3 < sVar4 - 1) {
    cmAlphaNum::cmAlphaNum
              (&local_a8,"Function invoked with incorrect arguments for function named: ");
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(&this->Args);
    cmAlphaNum::cmAlphaNum(&local_d8,pvVar5);
    cmStrCat<>((string *)local_78,&local_a8,&local_d8);
    cmExecutionStatus::SetError(inStatus,(string *)local_78);
    this_local._7_1_ = 0;
    functionScope._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    cmMakefile::FunctionPushPop::FunctionPushPop
              ((FunctionPushPop *)local_f0,
               (cmMakefile *)
               expandedArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->FilePath,&this->Policies);
    pbVar1 = expandedArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
    std::__cxx11::to_string((string *)local_120,sVar3);
    local_100 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_120);
    cmMakefile::AddDefinition
              ((cmMakefile *)pbVar1,(string *)(anonymous_namespace)::ARGC_abi_cxx11_,local_100);
    std::__cxx11::string::~string((string *)local_120);
    cmMakefile::MarkVariableAsUsed
              ((cmMakefile *)
               expandedArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)(anonymous_namespace)::ARGC_abi_cxx11_);
    value.field_2._12_4_ = 0;
    while( true ) {
      uVar6 = (ulong)(uint)value.field_2._12_4_;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_48);
      if (sVar3 <= uVar6) break;
      cmAlphaNum::cmAlphaNum(&local_178,(string *)(anonymous_namespace)::ARGV_abi_cxx11_);
      std::__cxx11::to_string(&local_1c8,value.field_2._12_4_);
      cmAlphaNum::cmAlphaNum(&local_1a8,&local_1c8);
      cmStrCat<>((string *)local_148,&local_178,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      pbVar1 = expandedArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(ulong)(uint)value.field_2._12_4_);
      sVar8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar7);
      cmMakefile::AddDefinition((cmMakefile *)pbVar1,(string *)local_148,sVar8);
      cmMakefile::MarkVariableAsUsed
                ((cmMakefile *)
                 expandedArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_148);
      std::__cxx11::string::~string((string *)local_148);
      value.field_2._12_4_ = value.field_2._12_4_ + 1;
    }
    local_1dc = 1;
    while( true ) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->Args);
      pbVar1 = expandedArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (sVar3 <= local_1dc) break;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->Args,(ulong)local_1dc);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(ulong)(local_1dc - 1));
      sVar8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar7);
      argvDef.field_2._8_8_ = sVar8._M_len;
      cmMakefile::AddDefinition((cmMakefile *)pbVar1,pvVar5,sVar8);
      local_1dc = local_1dc + 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_220,";");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&eit);
    cmJoin((string *)local_210,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48,local_220,_eit);
    argnDef.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->Args);
    local_278 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator+((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)&argnDef.field_2 + 8),sVar3 - 1);
    local_280 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_48);
    local_270 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (local_278,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_280);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_290,";");
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)local_260,&local_270,local_290);
    pbVar1 = expandedArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2a0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_210);
    cmMakefile::AddDefinition
              ((cmMakefile *)pbVar1,(string *)(anonymous_namespace)::ARGV_abi_cxx11_,local_2a0);
    cmMakefile::MarkVariableAsUsed
              ((cmMakefile *)
               expandedArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)(anonymous_namespace)::ARGV_abi_cxx11_);
    pbVar1 = expandedArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2b0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_260);
    cmMakefile::AddDefinition
              ((cmMakefile *)pbVar1,(string *)(anonymous_namespace)::ARGN_abi_cxx11_,local_2b0);
    cmMakefile::MarkVariableAsUsed
              ((cmMakefile *)
               expandedArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)(anonymous_namespace)::ARGN_abi_cxx11_);
    pbVar1 = expandedArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(&this->Args);
    local_2c0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar5);
    cmMakefile::AddDefinition
              ((cmMakefile *)pbVar1,
               (string *)(anonymous_namespace)::CMAKE_CURRENT_FUNCTION_abi_cxx11_,local_2c0);
    cmMakefile::MarkVariableAsUsed
              ((cmMakefile *)
               expandedArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)(anonymous_namespace)::CMAKE_CURRENT_FUNCTION_abi_cxx11_);
    pbVar1 = expandedArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2d0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->FilePath);
    cmMakefile::AddDefinition
              ((cmMakefile *)pbVar1,
               (string *)(anonymous_namespace)::CMAKE_CURRENT_FUNCTION_LIST_FILE_abi_cxx11_,
               local_2d0);
    cmMakefile::MarkVariableAsUsed
              ((cmMakefile *)
               expandedArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)(anonymous_namespace)::CMAKE_CURRENT_FUNCTION_LIST_FILE_abi_cxx11_);
    pbVar1 = expandedArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    cmsys::SystemTools::GetFilenamePath(&local_300,&this->FilePath);
    local_2e0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_300);
    cmMakefile::AddDefinition
              ((cmMakefile *)pbVar1,
               (string *)(anonymous_namespace)::CMAKE_CURRENT_FUNCTION_LIST_DIR_abi_cxx11_,local_2e0
              );
    std::__cxx11::string::~string((string *)&local_300);
    cmMakefile::MarkVariableAsUsed
              ((cmMakefile *)
               expandedArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)(anonymous_namespace)::CMAKE_CURRENT_FUNCTION_LIST_DIR_abi_cxx11_);
    pbVar1 = expandedArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::to_string((string *)&__range1,this->Line);
    local_310 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&__range1);
    cmMakefile::AddDefinition
              ((cmMakefile *)pbVar1,
               (string *)(anonymous_namespace)::CMAKE_CURRENT_FUNCTION_LIST_LINE_abi_cxx11_,
               local_310);
    std::__cxx11::string::~string((string *)&__range1);
    cmMakefile::MarkVariableAsUsed
              ((cmMakefile *)
               expandedArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)(anonymous_namespace)::CMAKE_CURRENT_FUNCTION_LIST_LINE_abi_cxx11_);
    __end1 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                       (&this->Functions);
    func = (cmListFileFunction *)
           std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                     (&this->Functions);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                  *)&func);
      if (!bVar2) break;
      status.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                    ::operator*(&__end1);
      cmExecutionStatus::cmExecutionStatus
                ((cmExecutionStatus *)local_398,
                 (cmMakefile *)
                 expandedArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_00 = expandedArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar1 = status.Variables.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_3c0);
      bVar2 = cmMakefile::ExecuteCommand
                        ((cmMakefile *)this_00,(cmListFileFunction *)pbVar1,
                         (cmExecutionStatus *)local_398,&local_3c0);
      local_471 = true;
      if (bVar2) {
        local_471 = cmExecutionStatus::GetNestedError((cmExecutionStatus *)local_398);
      }
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_3c0);
      if (local_471 == false) {
        bVar2 = cmExecutionStatus::GetReturnInvoked((cmExecutionStatus *)local_398);
        pbVar1 = expandedArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (bVar2) {
          variables = cmExecutionStatus::GetReturnVariables_abi_cxx11_
                                ((cmExecutionStatus *)local_398);
          cmMakefile::RaiseScope((cmMakefile *)pbVar1,variables);
          functionScope._12_4_ = 8;
        }
        else {
          functionScope._12_4_ = 0;
        }
      }
      else {
        cmMakefile::FunctionPushPop::Quiet((FunctionPushPop *)local_f0);
        cmExecutionStatus::SetNestedError(inStatus);
        this_local._7_1_ = 0;
        functionScope._12_4_ = 1;
      }
      cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_398);
      if (functionScope._12_4_ != 0) {
        if (functionScope._12_4_ != 8) goto LAB_0040bc6e;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = 1;
    functionScope._12_4_ = 1;
LAB_0040bc6e:
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::~string((string *)local_210);
    cmMakefile::FunctionPushPop::~FunctionPushPop((FunctionPushPop *)local_f0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFunctionHelperCommand::operator()(
  std::vector<cmListFileArgument> const& args,
  cmExecutionStatus& inStatus) const
{
  cmMakefile& makefile = inStatus.GetMakefile();

  // Expand the argument list to the function.
  std::vector<std::string> expandedArgs;
  makefile.ExpandArguments(args, expandedArgs);

  // make sure the number of arguments passed is at least the number
  // required by the signature
  if (expandedArgs.size() < this->Args.size() - 1) {
    auto const errorMsg = cmStrCat(
      "Function invoked with incorrect arguments for function named: ",
      this->Args.front());
    inStatus.SetError(errorMsg);
    return false;
  }

  cmMakefile::FunctionPushPop functionScope(&makefile, this->FilePath,
                                            this->Policies);

  // set the value of argc
  makefile.AddDefinition(ARGC, std::to_string(expandedArgs.size()));
  makefile.MarkVariableAsUsed(ARGC);

  // set the values for ARGV0 ARGV1 ...
  for (auto t = 0u; t < expandedArgs.size(); ++t) {
    auto const value = cmStrCat(ARGV, std::to_string(t));
    makefile.AddDefinition(value, expandedArgs[t]);
    makefile.MarkVariableAsUsed(value);
  }

  // define the formal arguments
  for (auto j = 1u; j < this->Args.size(); ++j) {
    makefile.AddDefinition(this->Args[j], expandedArgs[j - 1]);
  }

  // define ARGV and ARGN
  auto const argvDef = cmJoin(expandedArgs, ";");
  auto const eit = expandedArgs.begin() + (this->Args.size() - 1);
  auto const argnDef = cmJoin(cmMakeRange(eit, expandedArgs.end()), ";");
  makefile.AddDefinition(ARGV, argvDef);
  makefile.MarkVariableAsUsed(ARGV);
  makefile.AddDefinition(ARGN, argnDef);
  makefile.MarkVariableAsUsed(ARGN);

  makefile.AddDefinition(CMAKE_CURRENT_FUNCTION, this->Args.front());
  makefile.MarkVariableAsUsed(CMAKE_CURRENT_FUNCTION);
  makefile.AddDefinition(CMAKE_CURRENT_FUNCTION_LIST_FILE, this->FilePath);
  makefile.MarkVariableAsUsed(CMAKE_CURRENT_FUNCTION_LIST_FILE);
  makefile.AddDefinition(CMAKE_CURRENT_FUNCTION_LIST_DIR,
                         cmSystemTools::GetFilenamePath(this->FilePath));
  makefile.MarkVariableAsUsed(CMAKE_CURRENT_FUNCTION_LIST_DIR);
  makefile.AddDefinition(CMAKE_CURRENT_FUNCTION_LIST_LINE,
                         std::to_string(this->Line));
  makefile.MarkVariableAsUsed(CMAKE_CURRENT_FUNCTION_LIST_LINE);

  // Invoke all the functions that were collected in the block.
  // for each function
  for (cmListFileFunction const& func : this->Functions) {
    cmExecutionStatus status(makefile);
    if (!makefile.ExecuteCommand(func, status) || status.GetNestedError()) {
      // The error message should have already included the call stack
      // so we do not need to report an error here.
      functionScope.Quiet();
      inStatus.SetNestedError();
      return false;
    }
    if (status.GetReturnInvoked()) {
      makefile.RaiseScope(status.GetReturnVariables());
      break;
    }
  }

  // pop scope on the makefile
  return true;
}